

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Client * __thiscall
kj::_::NullableValue<capnproto_test::capnp::test::TestInterface::Client>::
emplace<capnproto_test::capnp::test::TestInterface::Client>
          (NullableValue<capnproto_test::capnp::test::TestInterface::Client> *this,Client *params)

{
  Client *params_00;
  Client *params_local;
  NullableValue<capnproto_test::capnp::test::TestInterface::Client> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<capnproto_test::capnp::test::TestInterface::Client>(&(this->field_1).value);
  }
  params_00 = fwd<capnproto_test::capnp::test::TestInterface::Client>(params);
  ctor<capnproto_test::capnp::test::TestInterface::Client,capnproto_test::capnp::test::TestInterface::Client>
            (&(this->field_1).value,params_00);
  this->isSet = true;
  return (Client *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }